

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindow::showEvent(QMdiSubWindow *this,QShowEvent *showEvent)

{
  uint uVar1;
  QMdiSubWindowPrivate *this_00;
  bool bVar2;
  QStyle *style;
  QSizeGrip *this_01;
  QSize QVar3;
  ulong uVar4;
  QMenuBar *this_02;
  QWidget *pQVar5;
  QWidget *pQVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QSize local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QWidget::showEvent(&this->super_QWidget,showEvent);
      return;
    }
  }
  else {
    style = QWidget::style(&this->super_QWidget);
    bVar2 = isMacStyle(style);
    if (bVar2) {
      bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this_00->sizeGrip);
      if ((!bVar2) &&
         (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>
           .super_QFlagsStorage<Qt::WindowType>.i & 0x800) == 0)) {
        this_01 = (QSizeGrip *)operator_new(0x28);
        QSizeGrip::QSizeGrip(this_01,&this->super_QWidget);
        QMdiSubWindowPrivate::setSizeGrip(this_00,this_01);
        bVar2 = QWidget::isMinimized(&this->super_QWidget);
        QMdiSubWindowPrivate::setSizeGripVisible(this_00,!bVar2);
        QVar3 = QWidget::size(&this->super_QWidget);
        uVar1 = (this_00->internalMinimumSize).wd.m_i;
        uVar7 = (ulong)uVar1;
        if ((int)uVar1 < QVar3.wd.m_i.m_i) {
          uVar7 = (ulong)QVar3 & 0xffffffff;
        }
        uVar1 = (this_00->internalMinimumSize).ht.m_i;
        uVar4 = (ulong)uVar1;
        if ((int)uVar1 < QVar3.ht.m_i.m_i) {
          uVar4 = (ulong)QVar3 >> 0x20;
        }
        local_30 = (QSize)(uVar7 | uVar4 << 0x20);
        QWidget::resize(&this->super_QWidget,&local_30);
      }
    }
    QMdiSubWindowPrivate::updateDirtyRegions(this_00);
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this_00->controlContainer);
    if (bVar2) {
      this_02 = QMdiSubWindowPrivate::menuBar(this_00);
      if (this_02 != (QMenuBar *)0x0) {
        pQVar5 = QMenuBar::cornerWidget(this_02,TopRightCorner);
        pQVar6 = maximizedButtonsWidget(this);
        if (pQVar5 != pQVar6) {
          QMdiSubWindowPrivate::showButtonsInMenuBar(this_00,this_02);
        }
      }
    }
    QMdiSubWindowPrivate::setActive(this_00,true,true);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::showEvent(QShowEvent *showEvent)
{
    Q_D(QMdiSubWindow);
    if (!parent()) {
        QWidget::showEvent(showEvent);
        return;
    }

#if QT_CONFIG(sizegrip)
    if (isMacStyle(style()) && !d->sizeGrip
            && !(windowFlags() & Qt::FramelessWindowHint)) {
        d->setSizeGrip(new QSizeGrip(this));
        Q_ASSERT(d->sizeGrip);
        if (isMinimized())
            d->setSizeGripVisible(false);
        else
            d->setSizeGripVisible(true);
        resize(size().expandedTo(d->internalMinimumSize));
    }
#endif

    d->updateDirtyRegions();
    // Show buttons in the menu bar if they're already not there.
    // We want to do this when QMdiSubWindow becomes visible after being hidden.
#if QT_CONFIG(menubar)
    if (d->controlContainer) {
        if (QMenuBar *menuBar = d->menuBar()) {
            if (menuBar->cornerWidget(Qt::TopRightCorner) != maximizedButtonsWidget())
                d->showButtonsInMenuBar(menuBar);
        }
    }
#endif
    d->setActive(true);
}